

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.h
# Opt level: O3

void __thiscall cell_map::cell_map(cell_map *this,int w,int h)

{
  value_type local_19;
  
  this->width = w;
  this->height = h;
  (this->cells).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cells).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cells).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_19 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->cells,(long)(h * w),&local_19);
  return;
}

Assistant:

cell_map(int w, int h) : width(w), height(h)
    {
    cells.resize(w*h, 0);
    }